

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  uint uVar1;
  undefined4 in_register_00000034;
  ExtensionInfo *info;
  ExtensionSet *this;
  KeyValue *pKVar2;
  KeyValue *this_00;
  long lVar3;
  long lVar4;
  KeyValue *pKVar5;
  bool bVar6;
  iterator iVar7;
  iterator iVar8;
  ExtensionSet local_40;
  TcParseTableBase *local_28;
  undefined8 local_20;
  LazyEagerVerifyFnType local_18;
  
  info = (ExtensionInfo *)CONCAT44(in_register_00000034,number);
  if ((type & 0xfe) == 10) {
    local_40._15_1_ = is_lazy;
    local_20 = 0;
    local_18 = verify_func;
    local_40.arena_ = (Arena *)extendee;
    local_40._8_4_ = number;
    local_40._12_1_ = type;
    local_40._13_1_ = is_repeated;
    local_40._14_1_ = is_packed;
    local_28 = MessageLite::GetTcParseTable(prototype);
    local_40.map_ = (AllocatedData)prototype;
    anon_unknown_58::Register((anon_unknown_58 *)&local_40,info);
    return;
  }
  this = &local_40;
  RegisterMessageExtension(this);
  if (this->arena_ == (Arena *)0x0) {
    lVar3 = (long)(short)this->flat_size_;
    this_00 = (this->map_).flat;
    if (lVar3 < 0) {
      iVar7 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::begin((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)this_00);
      iVar8 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)(this->map_).flat);
      ForEachPrefetchImpl<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::~btree_iterator()::__0,google::protobuf::internal::ExtensionSet::PrefetchNta>
                (iVar7.node_,iVar7.position_,iVar8.node_,iVar8._8_8_ & 0xffffffff);
    }
    else {
      lVar4 = lVar3 * 0x20;
      pKVar2 = this_00;
      if (this->flat_size_ != 0) {
        uVar1 = 0;
        do {
          lVar4 = lVar4 + -0x20;
          Extension::PrefetchPtr(&pKVar2->second);
          pKVar2 = pKVar2 + 1;
          if (lVar4 == 0) break;
          bVar6 = uVar1 < 0xf;
          uVar1 = uVar1 + 1;
        } while (bVar6);
      }
      pKVar5 = this_00 + lVar3;
      for (; pKVar2 != pKVar5; pKVar2 = pKVar2 + 1) {
        Extension::Free(&this_00->second);
        Extension::PrefetchPtr(&pKVar2->second);
        this_00 = this_00 + 1;
      }
      for (; this_00 != pKVar5; this_00 = this_00 + 1) {
        Extension::Free(&this_00->second);
      }
    }
    if (-1 < (short)this->flat_size_) {
      operator_delete__((this->map_).flat,(ulong)this->flat_capacity_ << 5);
      return;
    }
    ~ExtensionSet((ExtensionSet *)(this->map_).flat);
  }
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }